

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O1

void __thiscall
QtMWidgets::NavigationBarPrivate::removeWidget(NavigationBarPrivate *this,QWidget *w)

{
  QWidget *pQVar1;
  QWidget *pQVar2;
  Type *pTVar3;
  Data *dd;
  NavigationItem *pNVar4;
  QSharedPointer<QtMWidgets::NavigationItem> *pQVar5;
  long lVar6;
  QWidget *w_00;
  QWidget *pQVar7;
  long lVar8;
  QVector<QSharedPointer<NavigationItem>_> tmp;
  QWidget *local_50;
  QArrayDataPointer<QSharedPointer<QtMWidgets::NavigationItem>_> local_48;
  
  local_50 = w;
  pQVar5 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                     (&this->itemsMap,&local_50);
  pTVar3 = pQVar5->value;
  dd = pQVar5->d;
  if (dd != (Data *)0x0) {
    LOCK();
    (dd->weakref)._q_value.super___atomic_base<int>._M_i =
         (dd->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (dd->strongref)._q_value.super___atomic_base<int>._M_i =
         (dd->strongref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::remove
            (&this->itemsMap,(char *)&local_50);
  w_00 = local_50;
  QStackedWidget::removeWidget((QWidget *)this->stack);
  local_48.d = (pTVar3->children).d.d;
  pQVar5 = (pTVar3->children).d.ptr;
  local_48.size = (pTVar3->children).d.size;
  if (local_48.d != (Data *)0x0) {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48.ptr = pQVar5;
  if (local_48.size != 0) {
    lVar8 = local_48.size << 4;
    lVar6 = 0;
    do {
      w_00 = *(QWidget **)(*(long *)((long)&pQVar5->value + lVar6) + 0x18);
      removeWidget(this,w_00);
      lVar6 = lVar6 + 0x10;
    } while (lVar8 != lVar6);
  }
  pNVar4 = pTVar3->parent;
  if (pNVar4 == (NavigationItem *)0x0) goto LAB_0016a5de;
  lVar6 = (pNVar4->children).d.size;
  if (lVar6 < 1) {
LAB_0016a5d2:
    w_00 = (QWidget *)0xffffffffffffffff;
  }
  else {
    pQVar7 = (QWidget *)0xfffffffffffffff0;
    do {
      pQVar1 = pQVar7 + lVar6 * -0x10;
      if (pQVar1 == (QWidget *)0xfffffffffffffff0) goto LAB_0016a5cc;
      w_00 = pQVar7 + 0x10;
      pQVar2 = pQVar7 + (long)((pNVar4->children).d.ptr + 1);
      pQVar7 = w_00;
    } while (*(Type **)pQVar2 != pTVar3);
    w_00 = (QWidget *)((long)w_00 >> 4);
LAB_0016a5cc:
    if (pQVar1 == (QWidget *)0xfffffffffffffff0) goto LAB_0016a5d2;
  }
  QList<QSharedPointer<QtMWidgets::NavigationItem>_>::removeAt(&pNVar4->children,(qsizetype)w_00);
LAB_0016a5de:
  QArrayDataPointer<QSharedPointer<QtMWidgets::NavigationItem>_>::~QArrayDataPointer(&local_48);
  QSharedPointer<QtMWidgets::NavigationItem>::deref(dd);
  return;
}

Assistant:

void
NavigationBarPrivate::removeWidget( QWidget * w )
{
	QSharedPointer< NavigationItem > item = itemsMap[ w ];

	itemsMap.remove( w );
	stack->removeWidget( w );

	const auto tmp = item->children;

	for( const auto & c : tmp )
		removeWidget( c->self );

	if( item->parent )
		item->parent->children.removeAt(
			item->parent->children.indexOf( item ) );
}